

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

prof_tdata_t * duckdb_je_prof_tdata_init(tsd_t *tsd)

{
  uint64_t tdata;
  prof_tdata_t *extraout_RAX;
  
  malloc_mutex_lock((tsdn_t *)tsd,&next_thr_uid_mtx);
  tdata = next_thr_uid;
  next_thr_uid = next_thr_uid + 1;
  next_thr_uid_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&next_thr_uid_mtx.field_0 + 0x48));
  duckdb_je_prof_thread_active_init_get((tsdn_t *)tsd);
  duckdb_je_prof_tdata_detach(tsd,(prof_tdata_t *)tdata);
  return extraout_RAX;
}

Assistant:

prof_tdata_t *
prof_tdata_init(tsd_t *tsd) {
	return prof_tdata_init_impl(tsd, prof_thr_uid_alloc(tsd_tsdn(tsd)), 0,
	    NULL, prof_thread_active_init_get(tsd_tsdn(tsd)));
}